

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynClassStaticIf * ParseClassStaticIf(ParseContext *ctx,bool nested)

{
  LexemeType LVar1;
  Lexeme *begin;
  SynClassStaticIf *pSVar2;
  int iVar3;
  SynBase *condition;
  undefined4 extraout_var;
  SynClassElements *trueBlock;
  SynClassStaticIf *pSVar4;
  undefined4 extraout_var_00;
  Lexeme *end;
  SynClassElements *falseBlock;
  undefined4 extraout_var_01;
  Lexeme *pLVar5;
  Lexeme *pos;
  undefined7 in_register_00000031;
  IntrusiveList<SynClassStaticIf> staticIfs;
  
  begin = ctx->currentLexeme;
  pLVar5 = begin;
  if ((int)CONCAT71(in_register_00000031,nested) == 0) {
    if (begin->type != lex_at) {
      return (SynClassStaticIf *)0x0;
    }
    pLVar5 = begin + 1;
  }
  if (pLVar5->type != lex_if) {
    return (SynClassStaticIf *)0x0;
  }
  ctx->currentLexeme = pLVar5 + 1;
  anon_unknown.dwarf_153727::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'if\'");
  condition = ParseAssignment(ctx);
  if (condition == (SynBase *)0x0) {
    anon_unknown.dwarf_153727::Report
              (ctx,ctx->currentLexeme,"ERROR: condition not found in \'if\' statement");
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    condition = (SynBase *)CONCAT44(extraout_var,iVar3);
    SynError::SynError((SynError *)condition,ctx->currentLexeme,ctx->currentLexeme);
  }
  anon_unknown.dwarf_153727::CheckConsume
            (ctx,lex_cparen,"ERROR: closing \')\' not found after \'if\' condition");
  LVar1 = ctx->currentLexeme->type;
  if (LVar1 == lex_ofigure) {
    ctx->currentLexeme = ctx->currentLexeme + 1;
  }
  trueBlock = ParseClassElements(ctx);
  if (LVar1 == lex_ofigure) {
    anon_unknown.dwarf_153727::CheckConsume(ctx,lex_cfigure,"ERROR: closing \'}\' not found");
  }
  pLVar5 = ctx->currentLexeme;
  if (pLVar5->type == lex_else) {
    ctx->currentLexeme = pLVar5 + 1;
    LVar1 = pLVar5[1].type;
    if (LVar1 == lex_if) {
      staticIfs.head = (SynClassStaticIf *)0x0;
      staticIfs.tail = (SynClassStaticIf *)0x0;
      pSVar4 = ParseClassStaticIf(ctx,true);
      IntrusiveList<SynClassStaticIf>::push_back(&staticIfs,pSVar4);
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xa0);
      falseBlock = (SynClassElements *)CONCAT44(extraout_var_00,iVar3);
      end = ParseContext::Previous(ctx);
      pSVar2 = staticIfs.tail;
      pSVar4 = staticIfs.head;
      SynBase::SynBase((SynBase *)falseBlock,0x3e,pLVar5 + 1,end);
      (falseBlock->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e4bd0;
      (falseBlock->typedefs).head = (SynTypedef *)0x0;
      (falseBlock->typedefs).tail = (SynTypedef *)0x0;
      (falseBlock->functions).head = (SynFunctionDefinition *)0x0;
      (falseBlock->functions).tail = (SynFunctionDefinition *)0x0;
      (falseBlock->accessors).head = (SynAccessor *)0x0;
      (falseBlock->accessors).tail = (SynAccessor *)0x0;
      (falseBlock->members).head = (SynVariableDefinitions *)0x0;
      (falseBlock->members).tail = (SynVariableDefinitions *)0x0;
      (falseBlock->constantSets).head = (SynConstantSet *)0x0;
      (falseBlock->constantSets).tail = (SynConstantSet *)0x0;
      (falseBlock->staticIfs).head = pSVar4;
      (falseBlock->staticIfs).tail = pSVar2;
    }
    else {
      if (LVar1 == lex_ofigure) {
        ctx->currentLexeme = pLVar5 + 2;
      }
      falseBlock = ParseClassElements(ctx);
      if (LVar1 == lex_ofigure) {
        anon_unknown.dwarf_153727::CheckConsume(ctx,lex_cfigure,"ERROR: closing \'}\' not found");
      }
    }
  }
  else {
    falseBlock = (SynClassElements *)0x0;
  }
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
  pLVar5 = ParseContext::Previous(ctx);
  SynClassStaticIf::SynClassStaticIf
            ((SynClassStaticIf *)CONCAT44(extraout_var_01,iVar3),begin,pLVar5,condition,trueBlock,
             falseBlock);
  return (SynClassStaticIf *)CONCAT44(extraout_var_01,iVar3);
}

Assistant:

SynClassStaticIf* ParseClassStaticIf(ParseContext &ctx, bool nested)
{
	Lexeme *start = ctx.currentLexeme;

	if(nested || ctx.Consume(lex_at))
	{
		if(!ctx.Consume(lex_if))
		{
			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'if'");

		SynBase *condition = ParseAssignment(ctx);

		if(!condition)
		{
			Report(ctx, ctx.Current(), "ERROR: condition not found in 'if' statement");

			condition = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after 'if' condition");

		bool hasBlock = ctx.Consume(lex_ofigure);

		SynClassElements *trueBlock = ParseClassElements(ctx);

		if(hasBlock)
			CheckConsume(ctx, lex_cfigure, "ERROR: closing '}' not found");

		SynClassElements *falseBlock = NULL;

		if(ctx.Consume(lex_else))
		{
			if(ctx.At(lex_if))
			{
				Lexeme *pos = ctx.currentLexeme;

				IntrusiveList<SynClassStaticIf> staticIfs;

				staticIfs.push_back(ParseClassStaticIf(ctx, true));

				falseBlock = new (ctx.get<SynClassElements>()) SynClassElements(pos, ctx.Previous(), IntrusiveList<SynTypedef>(), IntrusiveList<SynFunctionDefinition>(), IntrusiveList<SynAccessor>(), IntrusiveList<SynVariableDefinitions>(), IntrusiveList<SynConstantSet>(), staticIfs);
			}
			else
			{
				hasBlock = ctx.Consume(lex_ofigure);

				falseBlock = ParseClassElements(ctx);

				if(hasBlock)
					CheckConsume(ctx, lex_cfigure, "ERROR: closing '}' not found");
			}
		}

		return new (ctx.get<SynClassStaticIf>()) SynClassStaticIf(start, ctx.Previous(), condition, trueBlock, falseBlock);
	}

	return NULL;
}